

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O1

void operator_delete(void *p,size_t size)

{
  unsigned_short *puVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  void **ppvVar2;
  long lVar3;
  code *pcVar4;
  address_t n;
  BackendSlabMetadata *meta;
  address_t c_1;
  PagemapEntry *entry;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 *puVar10;
  address_t c;
  ulong uVar11;
  undefined8 *in_FS_OFFSET;
  
  uVar8 = (ulong)p >> 10 & 0xfffffffffffffff0;
  uVar6 = *(ulong *)((long)&((snmalloc::
                              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar8);
  puVar10 = (undefined1 *)(uVar6 & 0xffffffffffffff80);
  uVar9 = (uint)uVar6;
  if (puVar10 != (undefined1 *)0x0) {
    uVar11 = (size - 1) + (ulong)(size == 0);
    if (size < 0xe001) {
      uVar5 = (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar11 >> 4] + 0x40;
    }
    else {
      uVar5 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x3f;
    }
    if ((p != (void *)0x0) && (uVar5 != (uVar9 & 0x7f))) goto LAB_0010e88f;
  }
  entry = (PagemapEntry *)
          ((long)&((snmalloc::
                    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                    ::concretePagemap.body)->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta + uVar8);
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)puVar10) {
    uVar6 = (ulong)((uVar9 & 0x7f) << 5);
    if ((*(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 8) & (ulong)p) *
        *(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 0x18) <
        *(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 0x18)) {
      uVar6 = (entry->
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              ).super_MetaEntryBase.meta;
      meta = (BackendSlabMetadata *)(uVar6 & 0xfffffffffffffffe);
      uVar6 = uVar6 >> 3;
      uVar8 = (this->entropy).bit_source;
      uVar11 = uVar8 >> 1;
      (this->entropy).bit_source = uVar11 | (ulong)((uVar8 & 1) != 0) << 0x3f;
      uVar9 = (uint)uVar11 & 1;
      ppvVar2 = (meta->
                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ).free_queue.end._M_elems[uVar9];
      *(address_t *)((long)p + 8) =
           ((snmalloc::freelist::Object::key_root.key2 ^ uVar6) + (long)p) *
           (snmalloc::freelist::Object::key_root.key1 + (long)ppvVar2);
      *ppvVar2 = (void *)(snmalloc::freelist::Object::key_root.key_next ^ (ulong)p ^ uVar6);
      (meta->
      super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
      ).free_queue.end._M_elems[uVar9] = (void **)p;
      puVar1 = (meta->
               super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
               ).free_queue.length._M_elems + uVar9;
      *puVar1 = *puVar1 + 1;
      puVar10 = &(meta->
                 super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                 ).free_queue.field_0x24;
      *(short *)puVar10 = *(short *)puVar10 + -1;
      if (*(short *)puVar10 != 0) {
        return;
      }
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if (puVar10 == (undefined1 *)0x0) {
    if (p == (void *)0x0) {
      return;
    }
  }
  else if (-1 < (char)uVar6) {
    lVar3 = (this->remote_dealloc_cache).capacity;
    lVar7 = lVar3 - *(long *)(snmalloc::sizeclass_metadata + ((uVar9 & 0x7f) << 5));
    if (lVar7 == 0 || lVar3 < *(long *)(snmalloc::sizeclass_metadata + ((uVar9 & 0x7f) << 5))) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar7;
    if (p == (void *)0x0) {
      p = (void **)0x0;
    }
    else {
      *(undefined8 *)p = 0;
      *(undefined8 *)((long)p + 8) = 0;
    }
    uVar6 = *(ulong *)((long)&((snmalloc::
                                BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                ::concretePagemap.body)->
                              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                              ).super_MetaEntryBase.remote_and_sizeclass +
                      ((ulong)p >> 10 & 0xfffffffffffffff0));
    if ((void **)p == (void **)0x0) {
      p = (void **)0x0;
    }
    else {
      *(void **)p = (void *)0x0;
      *(void **)((long)p + 8) = (void *)0x0;
    }
    uVar6 = uVar6 >> 0xe & 0xff;
    ppvVar2 = (this->remote_dealloc_cache).list._M_elems[uVar6].end._M_elems[0];
    *(void **)((long)p + 8) =
         (void *)((snmalloc::RemoteAllocator::key_global.key2 + (long)p) *
                 (snmalloc::RemoteAllocator::key_global.key1 + (long)ppvVar2));
    *ppvVar2 = (void *)(snmalloc::RemoteAllocator::key_global.key_next ^ (ulong)p);
    (this->remote_dealloc_cache).list._M_elems[uVar6].end._M_elems[0] = (void **)p;
    return;
  }
LAB_0010e88f:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void operator delete(void* p, size_t size) EXCEPTSPEC
{
  snmalloc::libc::free_sized(p, size);
}